

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::uint_to_string(uint value,char *pDst,uint len)

{
  char *pcVar1;
  char *local_50;
  size_t i;
  size_t total_bytes;
  char *p;
  char buf [16];
  uint cBufSize;
  uint len_local;
  char *pDst_local;
  uint value_local;
  
  buf[7] = '\0';
  pcVar1 = buf + 6;
  pDst_local._0_4_ = value;
  do {
    total_bytes = (size_t)pcVar1;
    *(char *)total_bytes = (char)((ulong)(uint)pDst_local % 10) + '0';
    pDst_local._0_4_ = (uint)pDst_local / 10;
    pcVar1 = (char *)(total_bytes - 1);
  } while ((uint)pDst_local != 0);
  if ((char *)(ulong)len < buf + (7 - (total_bytes - 1))) {
    pDst_local._7_1_ = false;
  }
  else {
    for (local_50 = (char *)0x0; local_50 < buf + (7 - (total_bytes - 1)); local_50 = local_50 + 1)
    {
      pDst[(long)local_50] = local_50[total_bytes];
    }
    pDst_local._7_1_ = true;
  }
  return pDst_local._7_1_;
}

Assistant:

bool uint_to_string(uint value, char* pDst, uint len)
    {
        CRNLIB_ASSERT(pDst);

        const uint cBufSize = 16;
        char buf[cBufSize];

        char* p = buf + cBufSize - 1;

        *p-- = '\0';

        do
        {
            *p-- = static_cast<uint8>('0' + (value % 10));
            value /= 10;
        } while (value);

        const size_t total_bytes = (buf + cBufSize - 1) - p;
        if (total_bytes > len)
        {
            return false;
        }

        for (size_t i = 0; i < total_bytes; i++)
        {
            pDst[i] = p[1 + i];
        }

        return true;
    }